

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::serialize_multipart_formdata
                   (string *__return_storage_ptr__,MultipartFormDataItems *items,string *boundary,
                   bool finish)

{
  bool bVar1;
  string *__lhs;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_68;
  reference local_48;
  MultipartFormData *item;
  const_iterator __end2;
  const_iterator __begin2;
  MultipartFormDataItems *__range2;
  bool finish_local;
  string *boundary_local;
  MultipartFormDataItems *items_local;
  string *body;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end2 = std::vector<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_>::
           begin(items);
  item = (MultipartFormData *)
         std::vector<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_>::end
                   (items);
  while (bVar1 = __gnu_cxx::
                 operator==<const_httplib::MultipartFormData_*,_std::vector<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_>_>
                           (&__end2,(__normal_iterator<const_httplib::MultipartFormData_*,_std::vector<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_>_>
                                     *)&item), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_httplib::MultipartFormData_*,_std::vector<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_>_>
               ::operator*(&__end2);
    serialize_multipart_formdata_item_begin<httplib::MultipartFormData>(&local_68,local_48,boundary)
    ;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    __lhs = &local_48->content;
    serialize_multipart_formdata_item_end_abi_cxx11_();
    std::operator+(&local_98,__lhs,&local_b8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    __gnu_cxx::
    __normal_iterator<const_httplib::MultipartFormData_*,_std::vector<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_>_>
    ::operator++(&__end2);
  }
  if (finish) {
    serialize_multipart_formdata_finish(&local_d8,boundary);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              (__return_storage_ptr__,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string
serialize_multipart_formdata(const MultipartFormDataItems &items,
                             const std::string &boundary, bool finish = true) {
  std::string body;

  for (const auto &item : items) {
    body += serialize_multipart_formdata_item_begin(item, boundary);
    body += item.content + serialize_multipart_formdata_item_end();
  }

  if (finish) body += serialize_multipart_formdata_finish(boundary);

  return body;
}